

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1686:21),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1688:8)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1686:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1688:8)>
          *this,ExceptionOrValue *output)

{
  size_t extraout_RAX;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
  *output_00;
  DebugExpression<kj::StringPtr> local_3c8;
  DebugComparison<kj::StringPtr,_const_char_(&)[12]> _kjCondition;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
  depResult;
  ExceptionOr<kj::_::Void> local_1a8;
  
  output_00 = &depResult;
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&output_00->super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    if (depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ == 0)
    goto LAB_001eab92;
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_001eac28;
    capnp::_::(anonymous_namespace)::TestCase1647::run()::$_0::operator()
              ((__0 *)this,
               (Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults> *)output_00);
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         extraout_RAX;
LAB_001eab92:
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr = "";
  }
  local_3c8.value.content.size_ =
       depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ +
       (depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ == 0)
  ;
  local_3c8.value.content.ptr =
       depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr;
  DebugExpression<kj::StringPtr>::operator==(&_kjCondition,&local_3c8,(char (*) [12])"intercepted");
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::
    log<char_const(&)[53],kj::_::DebugComparison<kj::StringPtr,char_const(&)[12]>&,kj::Exception&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x699,ERROR,
               "\"failed: expected \" \"e.getDescription() == \\\"intercepted\\\"\", _kjCondition, e"
               ,(char (*) [53])"failed: expected e.getDescription() == \"intercepted\"",
               &_kjCondition,&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a8.value.ptr.isSet = true;
  ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1a8);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
LAB_001eac28:
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::
  ~ExceptionOr(&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }